

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

bool __thiscall
ON_OBSOLETE_V5_Annotation::Transform(ON_OBSOLETE_V5_Annotation *this,ON_Xform *xform)

{
  double *pdVar1;
  uint uVar2;
  double d0;
  double dVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ON_2dPoint OVar7;
  ON_3dVector vy;
  ON_3dVector vx;
  ON_Xform xfscale;
  ON_2dPoint local_f8;
  ON_3dVector local_e8;
  ON_3dVector local_c8;
  ON_Xform local_b0;
  
  ON_Geometry::Transform(&this->super_ON_Geometry,xform);
  local_c8.z = (this->m_plane).xaxis.z;
  local_c8.x = (this->m_plane).xaxis.x;
  local_c8.y = (this->m_plane).xaxis.y;
  local_e8.z = (this->m_plane).yaxis.z;
  local_e8.x = (this->m_plane).yaxis.x;
  local_e8.y = (this->m_plane).yaxis.y;
  ON_3dVector::Transform(&local_c8,xform);
  ON_3dVector::Transform(&local_e8,xform);
  d0 = ON_3dVector::Length(&local_c8);
  dVar3 = ON_3dVector::Length(&local_e8);
  if ((((0.0001 < ABS(d0)) && (0.0001 < ABS(d0 + -1.0))) ||
      ((0.0001 < ABS(dVar3) && (0.0001 < ABS(dVar3 + -1.0))))) &&
     (ON_Xform::DiagonalTransformation(&local_b0,d0,dVar3,1.0),
     0 < (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count)) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      OVar7 = Point(this,(int)uVar6);
      local_f8.y = OVar7.y;
      local_f8.x = OVar7.x;
      ON_2dPoint::Transform(&local_f8,&local_b0);
      uVar2 = (this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count;
      if ((long)uVar6 < (long)(int)uVar2) {
        pdVar1 = (double *)
                 ((long)&((this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_a)->x + lVar5);
        *pdVar1 = local_f8.x;
        pdVar1[1] = local_f8.y;
      }
      else if (uVar6 == uVar2) {
        ON_SimpleArray<ON_2dPoint>::Append
                  (&(this->m_points).super_ON_SimpleArray<ON_2dPoint>,&local_f8);
      }
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while ((long)uVar6 < (long)(this->m_points).super_ON_SimpleArray<ON_2dPoint>.m_count);
  }
  if ((this->m_type == dtTextBlock) &&
     (dVar3 = this->m_textheight * dVar3, 1.490116119385e-08 < dVar3)) {
    this->m_textheight = dVar3;
  }
  bVar4 = ON_Plane::Transform(&this->m_plane,xform);
  return bVar4;
}

Assistant:

bool ON_OBSOLETE_V5_Annotation::Transform( const ON_Xform& xform )
{
  ON_Geometry::Transform(xform);
  const double tol = 1.0e-4;
  ON_3dVector vx = Plane().xaxis;
  ON_3dVector vy = Plane().yaxis;
  vx.Transform(xform);
  vy.Transform(xform);
  double sx = vx.Length();
  double sy = vy.Length();
  if ((fabs(sx - 1.0) > tol && fabs(sx) > tol) ||
      (fabs(sy - 1.0) > tol && fabs(sy) > tol))
  {
    ON_Xform xfscale(ON_Xform::DiagonalTransformation(sx, sy, 1.0));

    ON_2dPoint p;
    for (int i = 0; i < m_points.Count(); i++)
    {
      p = Point(i);
      p.Transform(xfscale);
      SetPoint(i, p);
    }
  }
  // This scales the text height on text but not on dimensions
  if (ON_OBSOLETE_V5_Annotation::IsText())
  {
    SetHeight(sy * Height());
  }

  return m_plane.Transform(xform);
}